

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::allocate<spirv_cross::SPIRAccessChain&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,SPIRAccessChain *p)

{
  Vector<spirv_cross::SPIRAccessChain_*> *this_00;
  SPIRAccessChain *pSVar1;
  size_t sVar2;
  ulong count;
  bool bVar3;
  SPIRAccessChain *ptr;
  SPIRAccessChain *local_40;
  SPIRAccessChain *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRAccessChain *)malloc(count * 0xa8);
    if (pSVar1 == (SPIRAccessChain *)0x0) {
      return (SPIRAccessChain *)0x0;
    }
    local_38 = pSVar1;
    SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve(this_00,count);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRAccessChain*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRAccessChain_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::pop_back(this_00);
  SPIRAccessChain::SPIRAccessChain(pSVar1,p);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}